

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O1

void __thiscall
jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
basic_json<int,void>
          (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *this,int *val)

{
  anon_union_16_15_54cbd7ed_for_basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_5
  local_18;
  
  local_18.int64_.val_ = (int64_t)*val;
  local_18.common_ = (common_storage)0x2;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::uninitialized_move
            ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)this,
             (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
             &local_18.common_);
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::destroy
            ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
             &local_18.common_);
  return;
}

Assistant:

basic_json(const T& val)
            : basic_json(json_type_traits<basic_json,T>::to_json(val))
        {
        }